

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,StringPiece *lhs,SymbolEntry *rhs)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  StringPiece y;
  StringPiece SVar5;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  StringPiece local_90;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_70;
  StringPiece local_50;
  char *local_40;
  size_type sStack_38;
  
  local_50.ptr_ = lhs->ptr_;
  local_50.length_ = lhs->length_;
  local_40 = (char *)0x0;
  sStack_38 = 0;
  GetParts(&local_70,this,rhs);
  local_90 = stringpiece_internal::StringPiece::substr(&local_50,0,local_70.first.length_);
  SVar5 = stringpiece_internal::StringPiece::substr(&local_70.first,0,local_50.length_);
  iVar3 = stringpiece_internal::StringPiece::compare(&local_90,SVar5);
  if (iVar3 == 0) {
    if (local_50.length_ == local_70.first.length_) {
      SVar5.length_ = sStack_38;
      SVar5.ptr_ = local_40;
      bVar2 = stringpiece_internal::operator<(SVar5,local_70.second);
    }
    else {
      SVar5 = *lhs;
      AsString_abi_cxx11_((string *)&local_90,this,rhs);
      pcVar1 = local_90.ptr_;
      sVar4 = stringpiece_internal::StringPiece::CheckSize(local_90.length_);
      y.length_ = sVar4;
      y.ptr_ = pcVar1;
      bVar2 = stringpiece_internal::operator<(SVar5,y);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else {
    bVar2 = SUB41((uint)iVar3 >> 0x1f,0);
  }
  return bVar2;
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }